

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker.cc
# Opt level: O0

vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_> *
__thiscall
google::protobuf::compiler::cpp::anon_unknown_0::GenerateTrackerCalls
          (vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
           *__return_storage_ptr__,anon_unknown_0 *this,Options *opts,Descriptor *message,
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *alt_annotation,
          Span<const_google::protobuf::compiler::cpp::(anonymous_namespace)::Call> calls)

{
  string_view pc;
  string_view pc_00;
  string_view pc_01;
  bool bVar1;
  bool bVar2;
  iterator pCVar3;
  int *piVar4;
  basic_string_view<char,_std::char_traits<char>_> *pbVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  ulong uVar7;
  Descriptor *b;
  AlphaNum *in_R9;
  string_view sVar8;
  allocator<char> local_5f9;
  string local_5f8;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  AlphaNum local_5c8;
  undefined8 local_598;
  undefined8 uStack_590;
  AlphaNum local_588;
  string local_558;
  Sub local_538;
  Sub local_480;
  AlphaNum local_3c8;
  undefined1 local_398 [56];
  FeatureSet *local_360;
  AlphaNum local_358;
  AlphaNum local_328;
  string local_2f8;
  AlphaNum local_2d8;
  basic_string_view<char,_std::char_traits<char>_> local_2a8;
  AlphaNum local_298;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_268;
  size_t sStack_260;
  AlphaNum local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg;
  const_iterator __end5;
  const_iterator __begin5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range5;
  char *local_200;
  size_t local_1f8;
  char *pcStack_1f0;
  AlphaNum local_1e8;
  undefined1 auStack_1b8 [8];
  string_view arg_sep;
  undefined1 local_178 [48];
  string_view local_148;
  FieldDescriptor *local_138;
  OneofDescriptor *pOStack_130;
  Arg local_128;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined1 local_e0 [48];
  string_view local_b0 [2];
  undefined1 local_90 [8];
  string call_str;
  Call *call;
  iterator __end3;
  iterator __begin3;
  Span<const_google::protobuf::compiler::cpp::(anonymous_namespace)::Call> *__range3;
  flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *forbidden;
  bool enable_tracking;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *alt_annotation_local;
  Descriptor *message_local;
  Options *opts_local;
  Span<const_google::protobuf::compiler::cpp::(anonymous_namespace)::Call> calls_local;
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
  *subs;
  
  b = message;
  opts_local = (Options *)alt_annotation;
  calls_local.len_ = (size_type)__return_storage_ptr__;
  bVar1 = HasTracker((Descriptor *)opts,(Options *)this);
  std::
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>::
  vector(__return_storage_ptr__);
  __end3 = absl::lts_20250127::
           Span<const_google::protobuf::compiler::cpp::(anonymous_namespace)::Call>::begin
                     ((Span<const_google::protobuf::compiler::cpp::(anonymous_namespace)::Call> *)
                      &opts_local);
  pCVar3 = absl::lts_20250127::
           Span<const_google::protobuf::compiler::cpp::(anonymous_namespace)::Call>::end
                     ((Span<const_google::protobuf::compiler::cpp::(anonymous_namespace)::Call> *)
                      &opts_local);
  do {
    if (__end3 == pCVar3) {
      return __return_storage_ptr__;
    }
    call_str.field_2._8_8_ = __end3;
    std::__cxx11::string::string((string *)local_90);
    if ((bVar1) && ((*(byte *)(call_str.field_2._8_8_ + 0x58) & 1) == 0)) {
      bVar2 = absl::lts_20250127::container_internal::
              raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
              ::contains<std::basic_string_view<char,std::char_traits<char>>>
                        ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
                          *)(this + 0x98),
                         (key_arg<std::basic_string_view<char>_> *)call_str.field_2._8_8_);
      if (bVar2) goto LAB_003b9be3;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(local_b0,"$0.$1");
      local_f8 = 0x10;
      uStack_f0 = 0x9cf3e3;
      sVar8._M_str = (char *)0x9cf3e3;
      sVar8._M_len = 0x10;
      absl::lts_20250127::substitute_internal::Arg::Arg((Arg *)local_e0,sVar8);
      local_138 = (FieldDescriptor *)((string_view *)(call_str.field_2._8_8_ + 0x10))->_M_len;
      pOStack_130 = *(OneofDescriptor **)(call_str.field_2._8_8_ + 0x18);
      absl::lts_20250127::substitute_internal::Arg::Arg
                (&local_128,*(string_view *)(call_str.field_2._8_8_ + 0x10));
      b = (Descriptor *)local_e0;
      absl::lts_20250127::SubstituteAndAppend
                ((Nonnull<std::string_*>)local_90,local_b0[0],(Arg *)b,&local_128);
      bVar2 = std::optional<int>::has_value((optional<int> *)(call_str.field_2._8_8_ + 0x20));
      if (bVar2) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_148,"<$0>");
        piVar4 = std::optional<int>::operator*((optional<int> *)(call_str.field_2._8_8_ + 0x20));
        absl::lts_20250127::substitute_internal::Arg::Arg((Arg *)local_178,*piVar4);
        b = (Descriptor *)local_178;
        absl::lts_20250127::SubstituteAndAppend((Nonnull<std::string_*>)local_90,local_148,(Arg *)b)
        ;
      }
      absl::lts_20250127::AlphaNum::AlphaNum((AlphaNum *)&arg_sep._M_str,"(");
      absl::lts_20250127::StrAppend((Nonnull<std::string_*>)local_90,(AlphaNum *)&arg_sep._M_str);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)auStack_1b8,"");
      bVar2 = std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>::has_value
                        ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                         (call_str.field_2._8_8_ + 0x28));
      if (bVar2) {
        pbVar5 = std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>::operator*
                           ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                            (call_str.field_2._8_8_ + 0x28));
        local_1f8 = pbVar5->_M_len;
        pcStack_1f0 = pbVar5->_M_str;
        pc_01._M_len = pbVar5->_M_len;
        pc_01._M_str = pbVar5->_M_str;
        absl::lts_20250127::AlphaNum::AlphaNum(&local_1e8,pc_01);
        absl::lts_20250127::StrAppend((Nonnull<std::string_*>)local_90,&local_1e8);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)&__range5,", ");
        auStack_1b8 = (undefined1  [8])__range5;
        arg_sep._M_len = (size_t)local_200;
      }
      this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(call_str.field_2._8_8_ + 0x40);
      __end5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(this_00);
      arg = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end(this_00);
      while( true ) {
        bVar2 = __gnu_cxx::operator!=
                          (&__end5,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)&arg);
        if (!bVar2) break;
        local_228 = __gnu_cxx::
                    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&__end5);
        local_268 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)auStack_1b8;
        sStack_260 = arg_sep._M_len;
        pc_00._M_str = (char *)arg_sep._M_len;
        pc_00._M_len = (size_t)auStack_1b8;
        absl::lts_20250127::AlphaNum::AlphaNum(&local_258,pc_00);
        absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_298,local_228);
        absl::lts_20250127::StrAppend((Nonnull<std::string_*>)local_90,&local_258,&local_298);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_2a8,", ");
        auStack_1b8 = (undefined1  [8])local_2a8._M_len;
        arg_sep._M_len = (size_t)local_2a8._M_str;
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end5);
      }
      absl::lts_20250127::AlphaNum::AlphaNum(&local_2d8,");");
      absl::lts_20250127::StrAppend((Nonnull<std::string_*>)local_90,&local_2d8);
    }
    else {
LAB_003b9be3:
      if (((byte)this[0xcb] & 1) != 0) {
        bVar2 = std::
                optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::has_value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)message);
        if (bVar2) {
          pbVar6 = std::
                   optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)message);
          std::__cxx11::string::operator=((string *)local_90,(string *)pbVar6);
        }
      }
    }
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      std::__cxx11::string::push_back((char)local_90);
      if (bVar1) {
        absl::lts_20250127::AlphaNum::AlphaNum(&local_328,"if (::");
        sVar8 = ProtobufNamespace((Options *)this);
        unique0x10000b63 = sVar8;
        absl::lts_20250127::AlphaNum::AlphaNum(&local_358,sVar8);
        absl::lts_20250127::AlphaNum::AlphaNum
                  ((AlphaNum *)local_398,"::internal::cpp::IsTrackingEnabled()) ");
        absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
                  (&local_3c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90);
        b = (Descriptor *)local_398;
        absl::lts_20250127::StrCat_abi_cxx11_
                  (&local_2f8,(lts_20250127 *)&local_328,&local_358,(AlphaNum *)b,&local_3c8,in_R9);
        std::__cxx11::string::operator=((string *)local_90,(string *)&local_2f8);
        std::__cxx11::string::~string((string *)&local_2f8);
      }
    }
    local_598 = 9;
    uStack_590 = 0xa7d87a;
    pc._M_str = (char *)0xa7d87a;
    pc._M_len = 9;
    absl::lts_20250127::AlphaNum::AlphaNum(&local_588,pc);
    local_5d8 = *(undefined8 *)call_str.field_2._8_8_;
    uStack_5d0 = *(undefined8 *)(call_str.field_2._8_8_ + 8);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_5c8,*(string_view *)call_str.field_2._8_8_);
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_558,(lts_20250127 *)&local_588,&local_5c8,(AlphaNum *)b);
    io::Printer::Sub::Sub<std::__cxx11::string&>
              (&local_538,&local_558,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_5f8,";",&local_5f9);
    io::Printer::Sub::WithSuffix(&local_480,&local_538,&local_5f8);
    std::
    vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
    ::push_back(__return_storage_ptr__,&local_480);
    io::Printer::Sub::~Sub(&local_480);
    std::__cxx11::string::~string((string *)&local_5f8);
    std::allocator<char>::~allocator(&local_5f9);
    io::Printer::Sub::~Sub(&local_538);
    std::__cxx11::string::~string((string *)&local_558);
    std::__cxx11::string::~string((string *)local_90);
    __end3 = __end3 + 1;
  } while( true );
}

Assistant:

std::vector<Sub> GenerateTrackerCalls(
    const Options& opts, const Descriptor* message,
    absl::optional<std::string> alt_annotation, absl::Span<const Call> calls) {
  bool enable_tracking = HasTracker(message, opts);
  const auto& forbidden =
      opts.field_listener_options.forbidden_field_listener_events;

  std::vector<Sub> subs;
  for (const auto& call : calls) {
    std::string call_str;
    if (enable_tracking && !call.suppressed && !forbidden.contains(call.var)) {
      absl::SubstituteAndAppend(&call_str, "$0.$1", kTracker, call.call);
      if (call.field_index.has_value()) {
        absl::SubstituteAndAppend(&call_str, "<$0>", *call.field_index);
      }
      absl::StrAppend(&call_str, "(");

      absl::string_view arg_sep = "";
      if (call.thiz.has_value()) {
        absl::StrAppend(&call_str, *call.thiz);
        arg_sep = ", ";
      }

      for (const auto& arg : call.args) {
        absl::StrAppend(&call_str, arg_sep, arg);
        arg_sep = ", ";
      }

      absl::StrAppend(&call_str, ");");
    } else if (opts.annotate_accessor && alt_annotation.has_value()) {
      call_str = *alt_annotation;
    }

    if (!call_str.empty()) {
      // TODO: Until we migrate all of the C++ backend to use
      // Emit(), we need to include a newline here so that the line that follows
      // the annotation is on its own line.
      call_str.push_back('\n');
      if (enable_tracking) {
        call_str =
            absl::StrCat("if (::", ProtobufNamespace(opts),
                         "::internal::cpp::IsTrackingEnabled()) ", call_str);
      }
    }

    subs.push_back(
        Sub(absl::StrCat(kVarPrefix, call.var), call_str).WithSuffix(";"));
  }

  return subs;
}